

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O1

bool __thiscall
rcdiscover::Discover::getResponse
          (Discover *this,
          vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *info,
          int timeout_per_socket)

{
  pointer pfVar1;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<rcdiscover::DeviceInfo> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer *__ptr;
  _State_baseV2 *__tmp;
  pointer pSVar6;
  pointer this_00;
  bool bVar7;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  futures;
  timeval tv;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_198;
  Discover *local_190;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  local_188;
  pointer local_170;
  __basic_future<rcdiscover::DeviceInfo> local_168;
  _func_int *local_158;
  long local_150;
  _func_int **local_148 [2];
  DeviceInfo local_138;
  
  local_158 = (_func_int *)(long)(timeout_per_socket / 1000);
  local_150 = (long)((timeout_per_socket % 1000) * 1000);
  local_188.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (future<rcdiscover::DeviceInfo> *)0x0;
  local_188.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (future<rcdiscover::DeviceInfo> *)0x0;
  local_188.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar6 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_170 = (this->sockets_).
              super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_190 = this;
  if (pSVar6 != local_170) {
    local_190 = (Discover *)&this->req_nums_;
    do {
      local_138.iface_name._M_dataplus._M_p = (pointer)0x0;
      local_138.iface_name._M_string_length = 0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00111950;
      p_Var5 = p_Var3 + 1;
      p_Var3[2]._M_use_count = 0;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[3]._M_use_count = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001119a0;
      p_Var4 = (_Result<rcdiscover::DeviceInfo> *)operator_new(0x118);
      std::__future_base::_Result<rcdiscover::DeviceInfo>::_Result(p_Var4);
      p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
      *(pointer *)&p_Var3[4]._M_use_count = pSVar6;
      p_Var3[5]._vptr__Sp_counted_base = &local_158;
      *(Discover **)&p_Var3[5]._M_use_count = local_190;
      local_148[0] = (_func_int **)0x0;
      local_198 = (long *)operator_new(0x20);
      *local_198 = (long)&PTR___State_001119f8;
      local_198[1] = (long)p_Var5;
      local_198[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>
                           ::_M_run;
      local_198[3] = 0;
      std::thread::_M_start_thread(local_148,&local_198,0);
      if (local_198 != (long *)0x0) {
        (**(code **)(*local_198 + 8))();
      }
      sVar2 = local_138.iface_name._M_string_length;
      if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var3[3]._vptr__Sp_counted_base = local_148[0];
      bVar7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.iface_name._M_string_length
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_138.iface_name._M_dataplus._M_p = (pointer)p_Var5;
      local_138.iface_name._M_string_length = (size_type)p_Var3;
      if (bVar7) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.iface_name._M_dataplus._M_p ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00111a38;
        p_Var5[2]._M_use_count = 0;
        p_Var5[1]._M_use_count = 0;
        p_Var5[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
        p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00111a88;
        p_Var4 = (_Result<rcdiscover::DeviceInfo> *)operator_new(0x118);
        std::__future_base::_Result<rcdiscover::DeviceInfo>::_Result(p_Var4);
        sVar2 = local_138.iface_name._M_string_length;
        p_Var5[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
        *(pointer *)&p_Var5[3]._M_use_count = pSVar6;
        p_Var5[4]._vptr__Sp_counted_base = &local_158;
        *(Discover **)&p_Var5[4]._M_use_count = local_190;
        bVar7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_138.iface_name._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_138.iface_name._M_dataplus._M_p = (pointer)(p_Var5 + 1);
        local_138.iface_name._M_string_length = (size_type)p_Var5;
        if (bVar7) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2);
        }
      }
      std::__basic_future<rcdiscover::DeviceInfo>::__basic_future
                (&local_168,(__state_type *)&local_138);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.iface_name._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_138.iface_name._M_string_length);
      }
      std::
      vector<std::future<rcdiscover::DeviceInfo>,std::allocator<std::future<rcdiscover::DeviceInfo>>>
      ::emplace_back<std::future<rcdiscover::DeviceInfo>>
                ((vector<std::future<rcdiscover::DeviceInfo>,std::allocator<std::future<rcdiscover::DeviceInfo>>>
                  *)&local_188,(future<rcdiscover::DeviceInfo> *)&local_168);
      if (local_168._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != local_170);
  }
  pfVar1 = local_188.
           super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = false;
  if (local_188.
      super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_188.
      super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = local_188.
              super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::future<rcdiscover::DeviceInfo>::get(&local_138,this_00);
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::
      emplace_back<rcdiscover::DeviceInfo>(info,&local_138);
      DeviceInfo::~DeviceInfo(&local_138);
      bVar7 = (bool)(bVar7 | *(long *)(*(long *)(info + 8) + -0xd8) != 0);
      this_00 = this_00 + 1;
    } while (this_00 != pfVar1);
  }
  std::
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ::~vector(&local_188);
  return bVar7;
}

Assistant:

bool Discover::getResponse(std::vector<DeviceInfo> &info,
                           int timeout_per_socket)
{
  // setup waiting for data to arrive

  struct timeval tv;
  tv.tv_sec=timeout_per_socket/1000;
  tv.tv_usec=(timeout_per_socket%1000)*1000;

  // try to get a valid package (repeat if an invalid package is received)

  const auto &req_nums = req_nums_;

  std::vector<std::future<DeviceInfo>> futures;
  for (auto &socket : sockets_)
  {
    futures.push_back(std::async(std::launch::async, [&socket, &tv, &req_nums]
    {
      DeviceInfo device_info(socket.getIfaceName());
      device_info.clear();

      int count = 10;

      auto sock = socket.getHandle<typename SocketType::SocketType>();

      fd_set fds;
      FD_ZERO(&fds);
      FD_SET(sock, &fds);

      while (!device_info.isValid() && count > 0)
      {
        count--;

        if (select(static_cast<int>(sock+1), &fds, NULL, NULL, &tv) > 0)
        {
          // get package

          uint8_t p[600];

          struct sockaddr_in addr;
#ifdef WIN32
          int naddr = sizeof(addr);
#else
          socklen_t naddr = sizeof(addr);
#endif
          memset(&addr, 0, naddr);

          long n = recvfrom(sock,
                            reinterpret_cast<char *>(p), sizeof(p), 0,
                            reinterpret_cast<struct sockaddr *>(&addr), &naddr);

          // check if received package is a valid discovery acknowledge

          if (n >= 8)
          {
            if (p[0] == 0 && p[1] == 0 && p[2] == 0 &&
                p[3] == 0x03)
            {
              if (std::find(req_nums.begin(), req_nums.end(),
                            std::make_tuple(p[6], p[7])) != req_nums.end())
              {
                size_t len=(static_cast<size_t>(p[4])<<8)|p[5];

                if (static_cast<size_t>(n) >= len+8)
                {
                  // extract information and store in list

                  device_info.set(p+8, len);
                }
              }
            }
          }
        }
        else
        {
          count=0;
        }
      }

      return device_info;
    }));

  }

  bool ret = false;
  for (auto &f : futures)
  {
    info.push_back(f.get());
    ret |= info.back().isValid();
  }

  return ret;
}